

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O1

void __thiscall Assimp::MD3Importer::MD3Importer(MD3Importer *this)

{
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0082f558;
  this->configFrameID = 0;
  this->configHandleMP = true;
  (this->configSkinFile)._M_dataplus._M_p = (pointer)&(this->configSkinFile).field_2;
  (this->configSkinFile)._M_string_length = 0;
  (this->configSkinFile).field_2._M_local_buf[0] = '\0';
  (this->configShaderFile)._M_dataplus._M_p = (pointer)&(this->configShaderFile).field_2;
  (this->configShaderFile)._M_string_length = 0;
  (this->configShaderFile).field_2._M_local_buf[0] = '\0';
  this->configSpeedFlag = false;
  this->pcHeader = (Header *)0x0;
  this->mBuffer = (uchar *)0x0;
  this->fileSize = 0;
  (this->mFile)._M_dataplus._M_p = (pointer)&(this->mFile).field_2;
  (this->mFile)._M_string_length = 0;
  (this->mFile).field_2._M_local_buf[0] = '\0';
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  this->mScene = (aiScene *)0x0;
  this->mIOHandler = (IOSystem *)0x0;
  return;
}

Assistant:

MD3Importer::MD3Importer()
    : configFrameID  (0)
    , configHandleMP (true)
    , configSpeedFlag()
    , pcHeader()
    , mBuffer()
    , fileSize()
    , mScene()
    , mIOHandler()
{}